

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.h
# Opt level: O2

void * __thiscall
rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>::Malloc
          (MemoryPoolAllocator<rapidjson::CrtAllocator> *this,size_t size)

{
  bool bVar1;
  size_t sVar2;
  ChunkHeader *pCVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (size == 0) {
    return (void *)0x0;
  }
  uVar4 = size + 7 & 0xfffffffffffffff8;
  pCVar3 = this->shared_->chunkHead;
  sVar2 = pCVar3->size;
  uVar5 = sVar2 + uVar4;
  if (pCVar3->capacity < uVar5) {
    uVar5 = this->chunk_capacity_;
    if (this->chunk_capacity_ <= uVar4) {
      uVar5 = uVar4;
    }
    bVar1 = AddChunk(this,uVar5);
    if (!bVar1) {
      return (void *)0x0;
    }
    pCVar3 = this->shared_->chunkHead;
    sVar2 = pCVar3->size;
    uVar5 = uVar4 + sVar2;
  }
  pCVar3->size = uVar5;
  return (void *)((long)&pCVar3[1].capacity + sVar2);
}

Assistant:

void* Malloc(size_t size) {
        RAPIDJSON_NOEXCEPT_ASSERT(shared_->refcount > 0);
        if (!size)
            return NULL;

        size = RAPIDJSON_ALIGN(size);
        if (RAPIDJSON_UNLIKELY(shared_->chunkHead->size + size > shared_->chunkHead->capacity))
            if (!AddChunk(chunk_capacity_ > size ? chunk_capacity_ : size))
                return NULL;

        void *buffer = GetChunkBuffer(shared_) + shared_->chunkHead->size;
        shared_->chunkHead->size += size;
        return buffer;
    }